

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermSubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::TermSubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handle
          (TermSubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this,LeafData *d,
          bool insert)

{
  Lhs LStack_48;
  
  Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs(&LStack_48,d);
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handle
            (&this->_inner,&LStack_48,insert);
  return;
}

Assistant:

void handle(LeafData d, bool insert) final override
  { _inner.handle(std::move(d), insert); }